

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printTypedVectorList
               (MCInst *MI,uint OpNum,SStream *O,uint NumLanes,char LaneKind,MCRegisterInfo *MRI)

{
  arm64_vess local_60;
  arm64_vas local_5c;
  arm64_vess vess;
  arm64_vas vas;
  char Suffix [32];
  MCRegisterInfo *MRI_local;
  char LaneKind_local;
  uint NumLanes_local;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  local_5c = ARM64_VAS_INVALID;
  local_60 = ARM64_VESS_INVALID;
  if (NumLanes == 0) {
    cs_snprintf((char *)&vess,0x20,".%c",(ulong)(uint)(int)LaneKind);
    switch(LaneKind) {
    case 'b':
      local_60 = ARM64_VESS_B;
      break;
    default:
      break;
    case 'd':
      local_60 = ARM64_VESS_D;
      break;
    case 'h':
      local_60 = ARM64_VESS_H;
      break;
    case 's':
      local_60 = ARM64_VESS_S;
    }
  }
  else {
    cs_snprintf((char *)&vess,0x20,".%u%c",(ulong)NumLanes,(ulong)(uint)(int)LaneKind);
    switch(LaneKind) {
    case 'b':
      if (NumLanes == 8) {
        local_5c = ARM64_VAS_8B;
      }
      else if (NumLanes == 0x10) {
        local_5c = ARM64_VAS_16B;
      }
      break;
    default:
      break;
    case 'd':
      if (NumLanes == 1) {
        local_5c = ARM64_VAS_1D;
      }
      else if (NumLanes == 2) {
        local_5c = ARM64_VAS_2D;
      }
      break;
    case 'h':
      if (NumLanes == 4) {
        local_5c = ARM64_VAS_4H;
      }
      else if (NumLanes == 8) {
        local_5c = ARM64_VAS_8H;
      }
      break;
    case 'q':
      if (NumLanes == 1) {
        local_5c = ARM64_VAS_1Q;
      }
      break;
    case 's':
      if (NumLanes == 2) {
        local_5c = ARM64_VAS_2S;
      }
      else if (NumLanes == 4) {
        local_5c = ARM64_VAS_4S;
      }
    }
  }
  printVectorList(MI,OpNum,O,(char *)&vess,MRI,local_5c,local_60);
  return;
}

Assistant:

static void printTypedVectorList(MCInst *MI, unsigned OpNum, SStream *O, unsigned NumLanes, char LaneKind, MCRegisterInfo *MRI)
{
	char Suffix[32];
	arm64_vas vas = 0;
	arm64_vess vess = 0;

	if (NumLanes) {
		cs_snprintf(Suffix, sizeof(Suffix), ".%u%c", NumLanes, LaneKind);
		switch(LaneKind) {
			default: break;
			case 'b':
				switch(NumLanes) {
					default: break;
					case 8:
							 vas = ARM64_VAS_8B;
							 break;
					case 16:
							 vas = ARM64_VAS_16B;
							 break;
				}
				break;
			case 'h':
				switch(NumLanes) {
					default: break;
					case 4:
							 vas = ARM64_VAS_4H;
							 break;
					case 8:
							 vas = ARM64_VAS_8H;
							 break;
				}
				break;
			case 's':
				switch(NumLanes) {
					default: break;
					case 2:
							 vas = ARM64_VAS_2S;
							 break;
					case 4:
							 vas = ARM64_VAS_4S;
							 break;
				}
				break;
			case 'd':
				switch(NumLanes) {
					default: break;
					case 1:
							 vas = ARM64_VAS_1D;
							 break;
					case 2:
							 vas = ARM64_VAS_2D;
							 break;
				}
				break;
			case 'q':
				switch(NumLanes) {
					default: break;
					case 1:
							 vas = ARM64_VAS_1Q;
							 break;
				}
				break;
		}
	} else {
		cs_snprintf(Suffix, sizeof(Suffix), ".%c", LaneKind);
		switch(LaneKind) {
			default: break;
			case 'b':
					 vess = ARM64_VESS_B;
					 break;
			case 'h':
					 vess = ARM64_VESS_H;
					 break;
			case 's':
					 vess = ARM64_VESS_S;
					 break;
			case 'd':
					 vess = ARM64_VESS_D;
					 break;
		}
	}

	printVectorList(MI, OpNum, O, Suffix, MRI, vas, vess);
}